

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eq2degComp.cpp
# Opt level: O0

void __thiscall Eq2degComp::computeRoots(Eq2degComp *this)

{
  double local_b0;
  complex<double> local_a8;
  double local_98;
  complex<double> local_90 [2];
  double local_70;
  complex<double> local_68;
  double local_58;
  complex<double> local_50 [2];
  undefined1 local_30 [8];
  complex<double> zDelta;
  complex<double> zRoot;
  Eq2degComp *this_local;
  
  std::complex<double>::complex((complex<double> *)(zDelta._M_value + 8),0.0,0.0);
  std::complex<double>::complex((complex<double> *)local_30,*(double *)&this->field_0x20,0.0);
  local_90[1]._M_value._8_8_ = 0;
  if ((*(double *)&this->field_0x20 != 0.0) || (NAN(*(double *)&this->field_0x20))) {
    local_58 = -*(double *)&this->field_0x10;
    std::sqrt<double>((complex<double> *)local_30);
    local_68._M_value._8_8_ = local_90[1]._M_value._8_8_;
    std::operator-(&local_58,&local_68);
    local_70 = *(double *)&this->field_0x8 * 2.0;
    local_50[0]._M_value._8_8_ = local_90[1]._M_value._8_8_;
    std::operator/(local_50,&local_70);
    local_50[1]._M_value._8_8_ = local_90[1]._M_value._8_8_;
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::push_back
              (&this->m_rac,(value_type *)(zDelta._M_value + 8));
    local_98 = -*(double *)&this->field_0x10;
    std::sqrt<double>((complex<double> *)local_30);
    local_a8._M_value._8_8_ = local_90[1]._M_value._8_8_;
    std::operator+(&local_98,&local_a8);
    local_b0 = *(double *)&this->field_0x8 * 2.0;
    local_90[0]._M_value._8_8_ = local_90[1]._M_value._8_8_;
    std::operator/(local_90,&local_b0);
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::push_back
              (&this->m_rac,(value_type *)(zDelta._M_value + 8));
  }
  else {
    std::complex<double>::operator=
              ((complex<double> *)(zDelta._M_value + 8),
               -*(double *)&this->field_0x10 / (*(double *)&this->field_0x8 * 2.0));
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::push_back
              (&this->m_rac,(value_type *)(zDelta._M_value + 8));
  }
  return;
}

Assistant:

void Eq2degComp::computeRoots(){
    std::complex<double> zRoot;
    std::complex<double> zDelta = m_delta;
    if (m_delta == 0){
        zRoot = -m_b/(2*m_a);
        m_rac.push_back(zRoot);
    }else{
        zRoot = (-m_b-sqrt(zDelta))/(2*m_a);
        m_rac.push_back(zRoot);
        zRoot = (-m_b+sqrt(zDelta))/(2*m_a);
        m_rac.push_back(zRoot);
    }
}